

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::extendRecording
          (ArchiveProxy *this,string *channel,int32_t streamId,Value sourceLocation,
          int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  ExtendRecordingRequest *pEVar2;
  uint64_t uVar3;
  undefined1 local_68 [8];
  ExtendRecordingRequest msg;
  int64_t correlationId_local;
  int64_t recordingId_local;
  Value sourceLocation_local;
  int32_t streamId_local;
  string *channel_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = correlationId;
  io::aeron::archive::codecs::ExtendRecordingRequest::ExtendRecordingRequest
            ((ExtendRecordingRequest *)local_68);
  pEVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ExtendRecordingRequest>
                     (this,(ExtendRecordingRequest *)local_68);
  pEVar2 = io::aeron::archive::codecs::ExtendRecordingRequest::controlSessionId
                     (pEVar2,controlSessionId);
  pEVar2 = io::aeron::archive::codecs::ExtendRecordingRequest::correlationId
                     (pEVar2,msg.m_actingVersion);
  pEVar2 = io::aeron::archive::codecs::ExtendRecordingRequest::recordingId(pEVar2,recordingId);
  pEVar2 = io::aeron::archive::codecs::ExtendRecordingRequest::streamId(pEVar2,streamId);
  pEVar2 = io::aeron::archive::codecs::ExtendRecordingRequest::sourceLocation(pEVar2,sourceLocation)
  ;
  io::aeron::archive::codecs::ExtendRecordingRequest::putChannel(pEVar2,channel);
  uVar3 = io::aeron::archive::codecs::ExtendRecordingRequest::encodedLength
                    ((ExtendRecordingRequest *)local_68);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::extendRecording(const std::string& channel, std::int32_t streamId,
                                   codecs::SourceLocation::Value sourceLocation, std::int64_t recordingId,
                                   std::int64_t correlationId, std::int64_t controlSessionId) {
    codecs::ExtendRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .streamId(streamId)
        .sourceLocation(sourceLocation)
        .putChannel(channel);

    return offer(msg.encodedLength());
}